

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O3

void xmlMemFree(void *ptr)

{
  xmlGenericErrorFunc UNRECOVERED_JUMPTABLE;
  xmlGenericErrorFunc *pp_Var1;
  void **ppvVar2;
  
  if (ptr == (void *)0x0) {
    return;
  }
  if (ptr == (void *)0xffffffffffffffff) {
    pp_Var1 = __xmlGenericError();
    UNRECOVERED_JUMPTABLE = *pp_Var1;
    ppvVar2 = __xmlGenericErrorContext();
    (*UNRECOVERED_JUMPTABLE)(*ppvVar2,"trying to free pointer from freed area\n");
  }
  else {
    if (xmlMemTraceBlockAt == ptr) {
      pp_Var1 = __xmlGenericError();
      UNRECOVERED_JUMPTABLE = *pp_Var1;
      ppvVar2 = __xmlGenericErrorContext();
      (*UNRECOVERED_JUMPTABLE)(*ppvVar2,"%p : Freed()\n",xmlMemTraceBlockAt);
      pp_Var1 = __xmlGenericError();
      UNRECOVERED_JUMPTABLE = *pp_Var1;
      ppvVar2 = __xmlGenericErrorContext();
      (*UNRECOVERED_JUMPTABLE)
                (*ppvVar2,"xmlMallocBreakpoint reached on block %d\n",(ulong)xmlMemStopAtBlock);
    }
    if (*(int *)((long)ptr + -0x28) == 0x5aa5) {
      if (*(ulong *)((long)ptr + -0x20) == (ulong)xmlMemStopAtBlock) {
        pp_Var1 = __xmlGenericError();
        UNRECOVERED_JUMPTABLE = *pp_Var1;
        ppvVar2 = __xmlGenericErrorContext();
        (*UNRECOVERED_JUMPTABLE)
                  (*ppvVar2,"xmlMallocBreakpoint reached on block %d\n",(ulong)xmlMemStopAtBlock);
      }
      *(undefined4 *)((long)ptr + -0x28) = 0xffffa55a;
      memset(ptr,0xff,*(size_t *)((long)ptr + -0x18));
      xmlMutexLock(xmlMemMutex);
      debugMemSize = debugMemSize - *(long *)((long)ptr + -0x18);
      debugMemBlocks = debugMemBlocks - 1;
      xmlMutexUnlock(xmlMemMutex);
      free((void *)((long)ptr + -0x28));
      return;
    }
    pp_Var1 = __xmlGenericError();
    UNRECOVERED_JUMPTABLE = *pp_Var1;
    ppvVar2 = __xmlGenericErrorContext();
    (*UNRECOVERED_JUMPTABLE)
              (*ppvVar2,"Memory tag error occurs :%p \n\t bye\n",(void *)((long)ptr + -0x28));
  }
  pp_Var1 = __xmlGenericError();
  UNRECOVERED_JUMPTABLE = *pp_Var1;
  ppvVar2 = __xmlGenericErrorContext();
  (*UNRECOVERED_JUMPTABLE)(*ppvVar2,"xmlMemFree(%p) error\n",ptr);
  pp_Var1 = __xmlGenericError();
  UNRECOVERED_JUMPTABLE = *pp_Var1;
  ppvVar2 = __xmlGenericErrorContext();
  (*UNRECOVERED_JUMPTABLE)
            (*ppvVar2,"xmlMallocBreakpoint reached on block %d\n",(ulong)xmlMemStopAtBlock,
             UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void
xmlMemFree(void *ptr)
{
    MEMHDR *p;
    char *target;
#ifdef DEBUG_MEMORY
    size_t size;
#endif

    if (ptr == NULL)
	return;

    if (ptr == (void *) -1) {
	xmlGenericError(xmlGenericErrorContext,
	    "trying to free pointer from freed area\n");
        goto error;
    }

    if (xmlMemTraceBlockAt == ptr) {
	xmlGenericError(xmlGenericErrorContext,
			"%p : Freed()\n", xmlMemTraceBlockAt);
	xmlMallocBreakpoint();
    }

    TEST_POINT

    target = (char *) ptr;

    p = CLIENT_2_HDR(ptr);
    if (p->mh_tag != MEMTAG) {
        Mem_Tag_Err(p);
        goto error;
    }
    if (xmlMemStopAtBlock == p->mh_number) xmlMallocBreakpoint();
    p->mh_tag = ~MEMTAG;
    memset(target, -1, p->mh_size);
    xmlMutexLock(xmlMemMutex);
    debugMemSize -= p->mh_size;
    debugMemBlocks--;
#ifdef DEBUG_MEMORY
    size = p->mh_size;
#endif
#ifdef MEM_LIST
    debugmem_list_delete(p);
#endif
    xmlMutexUnlock(xmlMemMutex);

    free(p);

    TEST_POINT

#ifdef DEBUG_MEMORY
    xmlGenericError(xmlGenericErrorContext,
	    "Freed(%d) Ok\n", size);
#endif

    return;

error:
    xmlGenericError(xmlGenericErrorContext,
	    "xmlMemFree(%p) error\n", ptr);
    xmlMallocBreakpoint();
    return;
}